

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vocabulary.h
# Opt level: O1

void __thiscall NotFoundException::~NotFoundException(NotFoundException *this)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__NotFoundException_0014fd50;
  pcVar1 = (this->error_message)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->error_message).field_2) {
    operator_delete(pcVar1);
  }
  std::exception::~exception(&this->super_exception);
  operator_delete(this);
  return;
}

Assistant:

NotFoundException(string name) {
        this->error_message = name + " is not found";
    }